

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O1

size_t cache_getused(void)

{
  uint32_t uVar1;
  size_t sVar2;
  ulong uVar3;
  
  if (cache_size == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    uVar3 = 0;
    do {
      uVar1 = cache_status[uVar3];
      if ((int)uVar1 < 0) {
        cache_getused_cold_1();
      }
      sVar2 = (sVar2 + 1) - (ulong)(uVar1 == 0);
      uVar3 = uVar3 + 1;
    } while (uVar3 < cache_size);
  }
  return sVar2;
}

Assistant:

size_t
cache_getused()
{
    size_t result = 0;
    for (size_t i=0;i<cache_size;i++) {
        uint32_t s = cache_status[i];
        if (s & 0x80000000) fprintf(stderr, "cache_getuser: cache in use during cache_getused()\n");
        if (s) result++;
    }
    return result;
}